

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O3

void UnitTest::_UnitTest_Compare::printFirst(void)

{
  bool bVar1;
  size_t sVar2;
  char *__s;
  
  if (DAT_00106198 == '\0') {
    if (DAT_00106179 == '\0') {
      __s = _unittest_fail()::str;
      if (_unittest_fail()::str == (char *)0x0) {
        bVar1 = mayUseColor((ostream *)&std::cout);
        __s = " FAIL: ";
        _unittest_fail()::str = __s;
        if (bVar1) {
          __s = " \x1b[1;40;31mFAIL:\x1b[0m ";
          _unittest_fail()::str = __s;
        }
      }
    }
    else {
      __s = "XFAIL: ";
    }
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_3c26,4);
    return;
  }
  return;
}

Assistant:

static void printFirst() {  // {{{2
    if (!global_unit_test_object_.vim_lines) {
      std::cout << _unittest_fail() << "┍ ";
    }
  }